

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.c
# Opt level: O2

Bigint * lshift(Bigint *b,int k)

{
  uint *puVar1;
  undefined4 *puVar2;
  sbyte sVar3;
  int iVar4;
  Bigint *pBVar5;
  uint32 *puVar6;
  int iVar7;
  long lVar8;
  uint uVar9;
  int iVar10;
  bool bVar11;
  
  pBVar5 = b;
  if (b->wds != 1 || b->x[0] != 0) {
    uVar9 = (uint)k >> 5;
    iVar7 = b->k;
    iVar10 = b->wds + uVar9;
    for (iVar4 = b->maxwds; iVar4 <= iVar10; iVar4 = iVar4 * 2) {
      iVar7 = iVar7 + 1;
    }
    pBVar5 = Balloc(iVar7);
    if (pBVar5 == (Bigint *)0x0) {
      pBVar5 = (Bigint *)0x0;
    }
    else {
      puVar6 = pBVar5->x;
      while (bVar11 = uVar9 != 0, uVar9 = uVar9 - 1, bVar11) {
        *puVar6 = 0;
        puVar6 = puVar6 + 1;
      }
      iVar7 = b->wds;
      if ((k & 0x1fU) == 0) {
        lVar8 = 0;
        do {
          puVar2 = (undefined4 *)((long)b->x + lVar8);
          *(undefined4 *)((long)puVar6 + lVar8) = *puVar2;
          lVar8 = lVar8 + 4;
        } while (puVar2 + 1 < b->x + iVar7);
      }
      else {
        sVar3 = (sbyte)(k & 0x1fU);
        lVar8 = 0;
        uVar9 = 0;
        do {
          puVar1 = (uint *)((long)b->x + lVar8);
          *(uint *)((long)puVar6 + lVar8) = *puVar1 << sVar3 | uVar9;
          uVar9 = *puVar1 >> (0x20U - sVar3 & 0x1f);
          lVar8 = lVar8 + 4;
        } while (puVar1 + 1 < b->x + iVar7);
        *(uint *)((long)puVar6 + lVar8) = uVar9;
        iVar10 = (iVar10 + 1) - (uint)(uVar9 == 0);
      }
      pBVar5->wds = iVar10;
    }
    Bfree(b);
  }
  return pBVar5;
}

Assistant:

static Bigint *
lshift(Bigint *b, int k)
{
    int i, k1, n, n1;
    Bigint *b1;
    ULong *x, *x1, *xe, z;

    if (!k || (!b->x[0] && b->wds == 1))
        return b;

    n = k >> 5;
    k1 = b->k;
    n1 = n + b->wds + 1;
    for(i = b->maxwds; n1 > i; i <<= 1)
        k1++;
    b1 = Balloc(k1);
    if (b1 == NULL) {
        Bfree(b);
        return NULL;
    }
    x1 = b1->x;
    for(i = 0; i < n; i++)
        *x1++ = 0;
    x = b->x;
    xe = x + b->wds;
    if (k &= 0x1f) {
        k1 = 32 - k;
        z = 0;
        do {
            *x1++ = *x << k | z;
            z = *x++ >> k1;
        }
        while(x < xe);
        if ((*x1 = z))
            ++n1;
    }
    else do
             *x1++ = *x++;
        while(x < xe);
    b1->wds = n1 - 1;
    Bfree(b);
    return b1;
}